

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::usda::EnumHandler<tinyusdz::APISchemas::APIName>
            (expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *prop_name,string *tok,
            vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
            *enums)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppVar4;
  _Alloc_hider _Var5;
  int iVar6;
  pointer ppVar7;
  ostream *poVar8;
  long *plVar9;
  ulong *puVar10;
  pointer pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type sVar13;
  long lVar14;
  ulong uVar15;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  undefined1 local_2e0 [24];
  long lStack_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  ulong local_2b0;
  long lStack_2a8;
  string local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  long local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string *local_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  string *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined2 *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  byte local_188;
  ios_base local_138 [264];
  
  local_240 = prop_name;
  if ((enums->
      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (enums->
      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00149728:
    local_188 = 1;
    local_1a8._M_dataplus._M_p._0_1_ = 1;
  }
  else {
    uVar15 = 0;
    do {
      iVar6 = ::std::__cxx11::string::compare((char *)tok);
      if (iVar6 == 0) goto LAB_00149728;
      uVar15 = uVar15 + 1;
      ppVar7 = (enums->
               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (enums->
               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar15 < (ulong)((long)ppVar4 - (long)ppVar7 >> 4));
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_210 = tok;
    if (ppVar4 != ppVar7) {
      lVar14 = 8;
      uVar15 = 0;
      do {
        ::std::__cxx11::string::string
                  ((string *)&local_1a8,*(char **)((long)&ppVar7->first + lVar14),
                   (allocator *)&local_260);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   &local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        uVar15 = uVar15 + 1;
        ppVar7 = (enums->
                 super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x10;
      } while (uVar15 < (ulong)((long)(enums->
                                      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >>
                               4));
    }
    local_278 = 2;
    local_270._M_allocated_capacity._0_3_ = 0x202c;
    paVar1 = &local_2a0.field_2;
    local_2a0.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_2a0._M_string_length = 1;
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    local_280 = &local_270;
    quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_2e0,&local_1e8,&local_2a0);
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    if (local_2e0._0_8_ != local_2e0._8_8_) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,((_Alloc_hider *)local_2e0._0_8_)->_M_p,
                 *(size_type *)(local_2e0._0_8_ + 8));
      local_2e0._0_8_ = local_2e0._0_8_ + 0x20;
      if (local_2e0._0_8_ != local_2e0._8_8_) {
        do {
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,local_280->_M_local_buf,local_278);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,(((pointer)local_2e0._0_8_)->_M_dataplus)._M_p,
                     ((pointer)local_2e0._0_8_)->_M_string_length);
          local_2e0._0_8_ = local_2e0._0_8_ + 0x20;
        } while (local_2e0._0_8_ != local_2e0._8_8_);
      }
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    tok = local_210;
    local_218 = &local_270;
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270._M_allocated_capacity + 1);
    }
    ::std::operator+(&local_208,"Allowed tokens are [",&local_260);
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_208);
    local_2c0._M_allocated_capacity = (size_type)&local_2b0;
    puVar10 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar10) {
      local_2b0 = *puVar10;
      lStack_2a8 = plVar9[3];
    }
    else {
      local_2b0 = *puVar10;
      local_2c0._M_allocated_capacity = (size_type)(ulong *)*plVar9;
    }
    local_2c0._8_8_ = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_1c8 = &local_1b8;
    local_1b8 = 0x22;
    local_1c0 = 1;
    paVar3 = &local_1a8.field_2;
    local_1a8._M_dataplus._M_p = (pointer)paVar3;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_1a8,local_1c8,(long)&local_1b8 + 1)
    ;
    ::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(tok->_M_dataplus)._M_p);
    plVar9 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    puVar10 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar10) {
      local_228 = *puVar10;
      lStack_220 = plVar9[3];
      local_238 = &local_228;
    }
    else {
      local_228 = *puVar10;
      local_238 = (ulong *)*plVar9;
    }
    local_230 = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    uVar15 = 0xf;
    if ((ulong *)local_2c0._M_allocated_capacity != &local_2b0) {
      uVar15 = local_2b0;
    }
    if (uVar15 < (ulong)(local_230 + local_2c0._8_8_)) {
      uVar15 = 0xf;
      if (local_238 != &local_228) {
        uVar15 = local_228;
      }
      if (uVar15 < (ulong)(local_230 + local_2c0._8_8_)) goto LAB_00149b78;
      plVar9 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_238,0,(char *)0x0,local_2c0._M_allocated_capacity);
    }
    else {
LAB_00149b78:
      plVar9 = (long *)::std::__cxx11::string::_M_append(local_2c0._M_local_buf,(ulong)local_238);
    }
    local_2e0._0_8_ = local_2e0 + 0x10;
    pbVar11 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pbVar11) {
      local_2e0._16_8_ = (pbVar11->_M_dataplus)._M_p;
      lStack_2c8 = plVar9[3];
    }
    else {
      local_2e0._16_8_ = (pbVar11->_M_dataplus)._M_p;
      local_2e0._0_8_ = (pointer)*plVar9;
    }
    local_2e0._8_8_ = plVar9[1];
    *plVar9 = (long)pbVar11;
    plVar9[1] = 0;
    *(undefined1 *)&(pbVar11->_M_dataplus)._M_p = 0;
    plVar9 = (long *)::std::__cxx11::string::append(local_2e0);
    local_280 = local_218;
    _Var5._M_p = (pointer)*plVar9;
    puVar10 = (ulong *)(plVar9 + 2);
    if ((ulong *)_Var5._M_p == puVar10) {
      local_2a0.field_2._M_allocated_capacity = *puVar10;
      local_2a0.field_2._8_8_ = plVar9[3];
      sVar13 = plVar9[1];
      *plVar9 = (long)puVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
LAB_00149c87:
      local_218->_M_allocated_capacity = local_2a0.field_2._M_allocated_capacity;
      (&local_280->_M_allocated_capacity)[1] = local_2a0.field_2._8_8_;
      local_2a0.field_2._M_allocated_capacity =
           local_2a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_188 = 0;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
LAB_00149cba:
      local_1a8.field_2._M_allocated_capacity = local_280->_M_allocated_capacity;
      local_1a8.field_2._8_8_ = (&local_280->_M_allocated_capacity)[1];
      _Var5._M_p = local_1a8._M_dataplus._M_p;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = plVar9[2];
      sVar13 = plVar9[1];
      *plVar9 = (long)puVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_2a0.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p == paVar1) goto LAB_00149c87;
      local_270._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
      local_2a0.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_188 = 0;
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
      local_280 = &local_270;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p == local_280) goto LAB_00149cba;
    }
    local_1a8._M_dataplus._M_p = _Var5._M_p;
    local_188 = 0;
    local_2a0._M_string_length = 0;
    local_278 = 0;
    local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
    local_2a0._M_dataplus._M_p = (pointer)paVar1;
    local_1a8._M_string_length = sVar13;
    if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
      operator_delete((void *)local_2e0._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_2e0._16_8_)->_M_p + 1));
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
    }
    if ((ulong *)local_2c0._M_allocated_capacity != &local_2b0) {
      operator_delete((void *)local_2c0._M_allocated_capacity,local_2b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_260.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
    if ((local_188 & 1) == 0) {
      local_260._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,local_1a8._M_dataplus._M_p,
                 local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar10 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                 super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 .field_0 + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p == paVar2) {
        *puVar10 = local_260.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x18) = local_260.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = local_260._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x10) = local_260.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = local_260._M_string_length;
      goto LAB_00149e11;
    }
  }
  ppVar4 = (enums->
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (enums->
                super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    iVar6 = ::std::__cxx11::string::compare((char *)tok);
    if (iVar6 == 0) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = ppVar7->first;
      goto LAB_00149e11;
    }
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"\"","");
  paVar2 = &local_260.field_2;
  local_260._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  ::std::__cxx11::string::_M_append((char *)&local_260,(ulong)(tok->_M_dataplus)._M_p);
  plVar9 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_260,(ulong)local_208._M_dataplus._M_p);
  puVar10 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar10) {
    local_2b0 = *puVar10;
    lStack_2a8 = plVar9[3];
    local_2c0._M_allocated_capacity = (size_type)&local_2b0;
  }
  else {
    local_2b0 = *puVar10;
    local_2c0._M_allocated_capacity = (size_type)(ulong *)*plVar9;
  }
  local_2c0._8_8_ = plVar9[1];
  *plVar9 = (long)puVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  plVar9 = (long *)::std::__cxx11::string::append(local_2c0._M_local_buf);
  pbVar11 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pbVar11) {
    local_2e0._16_8_ = (pbVar11->_M_dataplus)._M_p;
    lStack_2c8 = plVar9[3];
    local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
  }
  else {
    local_2e0._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_2e0._0_8_ = (pointer)*plVar9;
  }
  local_2e0._8_8_ = plVar9[1];
  *plVar9 = (long)pbVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)::std::__cxx11::string::_M_append(local_2e0,(ulong)(local_240->_M_dataplus)._M_p)
  ;
  puVar10 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2a0.field_2._M_allocated_capacity = *puVar10;
    local_2a0.field_2._8_8_ = plVar9[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *puVar10;
    local_2a0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_2a0._M_string_length = plVar9[1];
  *plVar9 = (long)puVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_2a0);
  local_280 = &local_270;
  puVar10 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_270._M_allocated_capacity = *puVar10;
    local_270._8_8_ = plVar9[3];
    paVar12 = local_280;
  }
  else {
    local_270._M_allocated_capacity = *puVar10;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9;
  }
  local_260.field_2._M_allocated_capacity = local_270._M_allocated_capacity;
  sVar13 = plVar9[1];
  *plVar9 = (long)puVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (paVar12 == local_280) {
    local_260.field_2._8_8_ = local_270._8_8_;
    paVar12 = paVar2;
  }
  local_278 = 0;
  local_270._M_allocated_capacity = local_270._M_allocated_capacity & 0xffffffffffffff00;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  puVar10 = (ulong *)((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x10);
  *(ulong **)
   &(__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0 = puVar10;
  if (paVar12 == paVar2) {
    *puVar10 = local_260.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x18) = local_260.field_2._8_8_;
  }
  else {
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(__return_storage_ptr__->contained).
          super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = paVar12;
    *(size_type *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0 + 0x10) = local_260.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar13;
  local_260._M_string_length = 0;
  local_260.field_2._M_allocated_capacity =
       local_260.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_260._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2e0._0_8_ != (pointer)(local_2e0 + 0x10)) {
    operator_delete((void *)local_2e0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2e0._16_8_)->_M_p + 1));
  }
  if ((ulong *)local_2c0._M_allocated_capacity != &local_2b0) {
    operator_delete((void *)local_2c0._M_allocated_capacity,local_2b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
LAB_00149e11:
  if ((local_188 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<T, std::string> EnumHandler(
    const std::string &prop_name, const std::string &tok,
    const std::vector<std::pair<T, const char *>> &enums) {
  auto ret = CheckAllowedTokens<T>(enums, tok);
  if (!ret) {
    return nonstd::make_unexpected(ret.error());
  }

  for (auto &item : enums) {
    if (tok == item.second) {
      return item.first;
    }
  }
  // Should never reach here, though.
  return nonstd::make_unexpected(
      quote(tok) + " is an invalid token for attribute `" + prop_name + "`");
}